

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint32_t __thiscall AmpIO::ReadCurrentKiRaw(AmpIO *this,uint index)

{
  BasePort *pBVar1;
  uint32_t local_18;
  uint local_14;
  uint32_t read_data;
  uint index_local;
  AmpIO *this_local;
  
  local_18 = 0;
  if ((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0) {
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    local_14 = index;
    _read_data = this;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)((index + 1) * 0x10 | 0x9002),&local_18);
  }
  return local_18;
}

Assistant:

uint32_t AmpIO::ReadCurrentKiRaw(unsigned int index) const
{
    uint32_t read_data = 0;
    if (port)
        port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_CURRENT_KI, read_data);
    return read_data;
}